

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::CallIndirectExpr::~CallIndirectExpr(CallIndirectExpr *this)

{
  (this->super_ExprMixin<(wabt::ExprType)14>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__CallIndirectExpr_002f1fe8;
  Var::~Var(&this->table);
  FuncDeclaration::~FuncDeclaration(&this->decl);
  return;
}

Assistant:

explicit CallIndirectExpr(const Location& loc = Location())
      : ExprMixin<ExprType::CallIndirect>(loc) {}